

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O1

void toml::detail::skip_array_like<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  size_t *psVar1;
  element_type *peVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *peVar9;
  bool bVar10;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  prev;
  location checkpoint;
  undefined1 local_199;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  sequence local_188;
  sequence local_168;
  location local_148;
  region local_100;
  region local_98;
  
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar6 = loc->location_;
  lVar4 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar5 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar4;
  if (uVar6 + 1 < uVar5) {
    if (*(char *)(lVar4 + uVar6) == '\n') {
      loc->line_number_ = loc->line_number_ + 1;
      sVar3 = 1;
    }
    else {
      sVar3 = loc->column_number_ + 1;
    }
    loc->column_number_ = sVar3;
    uVar5 = uVar6 + 1;
  }
  else if (uVar5 != uVar6) {
    sVar3 = loc->line_number_;
    sVar7 = loc->column_number_;
    do {
      if (*(char *)(lVar4 + uVar6) == '\n') {
        sVar3 = sVar3 + 1;
        loc->line_number_ = sVar3;
        sVar7 = 1;
      }
      else {
        sVar7 = sVar7 + 1;
      }
      loc->column_number_ = sVar7;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  loc->location_ = uVar5;
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar4 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar4;
  if (uVar6 <= uVar5) {
    return;
  }
  psVar1 = &loc->location_;
  p_Var8 = &(loc->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_190 = &loc->source_name_;
  do {
    if (*(char *)(lVar4 + uVar5) == '\"') {
LAB_0038f100:
      skip_string_like<toml::type_config>(loc,ctx);
    }
    else {
      if (uVar5 < uVar6) {
        if (*(char *)(lVar4 + uVar5) == '\'') goto LAB_0038f100;
        if (uVar5 < uVar6) {
          if (*(char *)(lVar4 + uVar5) == '#') {
            skip_comment_block<toml::type_config>(loc,ctx);
            goto LAB_0038f2e2;
          }
          if (uVar5 < uVar6) {
            if (*(char *)(lVar4 + uVar5) == '{') {
              skip_inline_table_like<toml::type_config>(loc,ctx);
              goto LAB_0038f2e2;
            }
            if (uVar5 < uVar6) {
              if (*(char *)(lVar4 + uVar5) == '[') {
                location::location(&local_148,loc);
                syntax::std_table(&local_188,&ctx->toml_spec_);
                local_198 = p_Var8;
                sequence::scan(&local_100,&local_188,loc);
                bVar10 = true;
                if (local_100.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr == (element_type *)0x0) {
                  syntax::array_table(&local_168,&ctx->toml_spec_);
                  sequence::scan(&local_98,&local_168,loc);
                  bVar10 = local_98.source_.
                           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr != (element_type *)0x0;
                  region::~region(&local_98);
                  std::
                  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                  ::~vector(&local_168.others_);
                }
                region::~region(&local_100);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector(&local_188.others_);
                p_Var8 = local_198;
                if (bVar10) {
                  (loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = local_148.source_.
                            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            (local_198,
                             &local_148.source_.
                              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                            (local_190,&local_148.source_name_);
                  loc->column_number_ = local_148.column_number_;
                  *psVar1 = local_148.location_;
                  loc->line_number_ = local_148.line_number_;
                }
                else {
                  skip_array_like<toml::type_config>(loc,ctx);
                }
                location::~location(&local_148);
                if (bVar10) {
                  return;
                }
                goto LAB_0038f2e2;
              }
              if (uVar5 < uVar6) {
                if (*(char *)(lVar4 + uVar5) == '=') {
                  sVar3 = *psVar1;
                  if (sVar3 == 0) {
                    return;
                  }
                  while( true ) {
                    loc->location_ = sVar3 - 1;
                    peVar2 = (loc->source_).
                             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    lVar4 = (long)(peVar2->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start;
                    if (*(char *)(lVar4 + -1 + sVar3) == '\n') {
                      peVar9 = (element_type *)(lVar4 + sVar3 + -1);
                      loc->line_number_ = loc->line_number_ - 1;
                      local_148.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)
                                (peVar2->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      local_199 = 10;
                      local_100.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = peVar9;
                      std::
                      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                                (&local_188,&local_100,&local_148,&local_199);
                      loc->column_number_ =
                           (long)peVar9 +
                           (1 - (long)local_188.super_scanner_base._vptr_scanner_base);
                    }
                    peVar2 = (loc->source_).
                             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                    lVar4 = (long)(peVar2->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start;
                    if ((loc->location_ <
                         (ulong)((long)(peVar2->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - lVar4)) &&
                       (*(char *)(lVar4 + loc->location_) == '\n')) break;
                    sVar3 = *psVar1;
                    if (sVar3 == 0) {
                      return;
                    }
                  }
                  location::advance(loc,1);
                  return;
                }
                if ((uVar5 < uVar6) && (*(char *)(lVar4 + uVar5) == ']')) {
                  return;
                }
              }
            }
          }
        }
      }
      if (uVar5 + 1 < uVar6) {
        if (*(char *)(lVar4 + uVar5) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar3 = 1;
        }
        else {
          sVar3 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar3;
        uVar6 = uVar5 + 1;
      }
      else if (uVar6 != uVar5) {
        sVar3 = loc->line_number_;
        sVar7 = loc->column_number_;
        do {
          if (*(char *)(lVar4 + uVar5) == '\n') {
            sVar3 = sVar3 + 1;
            loc->line_number_ = sVar3;
            sVar7 = 1;
          }
          else {
            sVar7 = sVar7 + 1;
          }
          loc->column_number_ = sVar7;
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      *psVar1 = uVar6;
    }
LAB_0038f2e2:
    peVar2 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar5 = loc->location_;
    lVar4 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar4;
    if (uVar6 <= uVar5) {
      return;
    }
  } while( true );
}

Assistant:

void skip_array_like(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    assert(loc.current() == '[');
    loc.advance();

    while( ! loc.eof())
    {
        if(loc.current() == '\"' || loc.current() == '\'')
        {
            skip_string_like(loc, ctx);
        }
        else if(loc.current() == '#')
        {
            skip_comment_block(loc, ctx);
        }
        else if(loc.current() == '{')
        {
            skip_inline_table_like(loc, ctx);
        }
        else if(loc.current() == '[')
        {
            const auto checkpoint = loc;
            if(syntax::std_table(spec).scan(loc).is_ok() ||
               syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = checkpoint;
                break;
            }
            // if it is not a table-definition, then it is an array.
            skip_array_like(loc, ctx);
        }
        else if(loc.current() == '=')
        {
            // key-value pair cannot be inside the array.
            // guessing the error is "missing closing bracket `]`".
            // find the previous key just before `=`.
            while(loc.get_location() != 0)
            {
                loc.retrace();
                if(loc.current() == '\n')
                {
                    loc.advance();
                    break;
                }
            }
            break;
        }
        else if(loc.current() == ']')
        {
            break; // found closing bracket
        }
        else
        {
            loc.advance();
        }
    }
    return ;
}